

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O0

void av1_cdef_mse_calc_block
               (CdefSearchCtx *cdef_search_ctx,aom_internal_error_info *error_info,int fbr,int fbc,
               int sb_count)

{
  uint64_t uVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  long *in_RDI;
  int in_R8D;
  uint64_t curr_mse;
  int sec_strength;
  int pri_strength;
  int gi;
  macroblockd_plane pd;
  int col;
  int row;
  int xsize;
  int ysize;
  int vfilt_size;
  int hfilt_size;
  int pli;
  int dirinit;
  int xoff;
  int yoff;
  _Bool is_fb_on_frm_bottom_boundary;
  _Bool is_fb_on_frm_top_boundary;
  _Bool is_fb_on_frm_right_boundary;
  _Bool is_fb_on_frm_left_boundary;
  int cdef_count;
  int ref_stride [3];
  uint8_t *ref_buffer [3];
  MB_MODE_INFO *mbmi;
  BLOCK_SIZE bs;
  int vb_step;
  int hb_step;
  int nvb;
  int nhb;
  uint16_t *in;
  int var [16] [16];
  int dir [16] [16];
  cdef_list dlist [1024];
  uint16_t inbuf [19008];
  int *mi_high_l2;
  int *mi_wide_l2;
  int coeff_shift;
  YV12_BUFFER_CONFIG *ref;
  CommonModeInfoParams *mi_params;
  undefined4 in_stack_ffffffffffff4fb4;
  undefined1 in_stack_ffffffffffff4fbc;
  undefined1 in_stack_ffffffffffff4fbd;
  undefined1 in_stack_ffffffffffff4fbe;
  undefined1 in_stack_ffffffffffff4fbf;
  int in_stack_ffffffffffff4fc0;
  int in_stack_ffffffffffff4fc4;
  int in_stack_ffffffffffff4fc8;
  undefined4 in_stack_ffffffffffff4fcc;
  BLOCK_SIZE in_stack_ffffffffffff4fe7;
  undefined4 in_stack_ffffffffffff4fe8;
  undefined4 in_stack_ffffffffffff4fec;
  int in_stack_ffffffffffff4ff0;
  int in_stack_ffffffffffff4ff4;
  CommonModeInfoParams *in_stack_ffffffffffff4ff8;
  int local_aff8;
  int local_aff4;
  int local_aff0;
  int local_afec;
  int local_afdc;
  int local_afd8;
  int local_afd4;
  undefined1 local_afd0 [16];
  undefined8 local_afc0;
  undefined4 local_afa8;
  int local_a59c;
  int local_a598;
  int local_a594;
  int local_a590;
  int local_a58c;
  int local_a588;
  int local_a584;
  undefined4 local_a580;
  int local_a57c;
  int local_a578;
  byte local_a574;
  undefined1 local_a573;
  byte local_a572;
  undefined1 local_a571;
  int local_a570;
  undefined4 local_a56c [3];
  byte *local_a560 [4];
  byte local_a539;
  int local_a538;
  int local_a534;
  int local_a530;
  int local_a52c;
  undefined1 *local_a528;
  undefined1 local_a520 [1024];
  undefined1 local_a120 [3664];
  undefined1 auStack_92d0 [37424];
  long *local_a0;
  long local_98;
  int local_8c;
  long local_88;
  long local_80;
  int local_74;
  int local_70;
  int local_6c;
  long *local_60;
  
  local_80 = in_RDI[1];
  local_88 = *in_RDI;
  local_8c = *(int *)((long)in_RDI + 0x1eb4);
  local_98 = (long)in_RDI + 0x1ec4;
  local_a0 = in_RDI + 0x3da;
  local_74 = in_R8D;
  local_70 = in_ECX;
  local_6c = in_EDX;
  local_60 = in_RDI;
  memset(local_a120,0,0x400);
  memset(local_a520,0,0x400);
  local_a528 = auStack_92d0;
  if (*(int *)(local_80 + 0x10) + local_70 * -0x10 < 0x11) {
    local_afec = *(int *)(local_80 + 0x10) + local_70 * -0x10;
  }
  else {
    local_afec = 0x10;
  }
  local_a52c = local_afec;
  if (*(int *)(local_80 + 0xc) + local_6c * -0x10 < 0x11) {
    local_aff0 = *(int *)(local_80 + 0xc) + local_6c * -0x10;
  }
  else {
    local_aff0 = 0x10;
  }
  local_a530 = local_aff0;
  local_a534 = 1;
  local_a538 = 1;
  local_a560[3] =
       *(byte **)(*(long *)(local_80 + 0x30) +
                 (long)(local_6c * 0x10 * *(int *)(local_80 + 0x3c) + local_70 * 0x10) * 8);
  local_a560[0] = *(byte **)(local_88 + 0x28);
  local_a560[1] = *(byte **)(local_88 + 0x30);
  local_a560[2] = *(byte **)(local_88 + 0x38);
  local_a56c[0] = *(undefined4 *)(local_88 + 0x20);
  local_a56c[1] = *(undefined4 *)(local_88 + 0x24);
  local_a56c[2] = *(undefined4 *)(local_88 + 0x24);
  if (((*local_a560[3] == 0xf) || (*local_a560[3] == 0xe)) || (*local_a560[3] == 0xd)) {
    local_a539 = *local_a560[3];
    if ((local_a539 == 0xf) || (local_a539 == 0xe)) {
      if (*(int *)(local_80 + 0x10) + local_70 * -0x10 < 0x21) {
        local_aff4 = *(int *)(local_80 + 0x10) + local_70 * -0x10;
      }
      else {
        local_aff4 = 0x20;
      }
      local_a52c = local_aff4;
      local_a534 = 2;
    }
    if ((local_a539 == 0xf) || (local_a539 == 0xd)) {
      if (*(int *)(local_80 + 0xc) + local_6c * -0x10 < 0x21) {
        local_aff8 = *(int *)(local_80 + 0xc) + local_6c * -0x10;
      }
      else {
        local_aff8 = 0x20;
      }
      local_a530 = local_aff8;
      local_a538 = 2;
    }
  }
  else {
    local_a539 = 0xc;
  }
  local_a570 = av1_cdef_compute_sb_list
                         (in_stack_ffffffffffff4ff8,in_stack_ffffffffffff4ff4,
                          in_stack_ffffffffffff4ff0,
                          (cdef_list *)CONCAT44(in_stack_ffffffffffff4fec,in_stack_ffffffffffff4fe8)
                          ,in_stack_ffffffffffff4fe7);
  local_a571 = local_70 == 0;
  local_a572 = local_70 + local_a534 == *(int *)((long)local_60 + 0x1f04);
  local_a573 = local_6c == 0;
  local_a574 = local_6c + local_a538 == (int)local_60[0x3e0];
  local_a578 = (uint)((local_a573 ^ 0xff) & 1) << 1;
  local_a57c = (uint)((local_a571 ^ 0xff) & 1) << 3;
  local_a580 = 0;
  for (local_a584 = 0; local_a584 < (int)local_60[0x3d8]; local_a584 = local_a584 + 1) {
    local_a588 = local_a52c << ((byte)*(undefined4 *)(local_98 + (long)local_a584 * 4) & 0x1f);
    local_a58c = local_a530 << ((byte)*(undefined4 *)((long)local_a0 + (long)local_a584 * 4) & 0x1f)
    ;
    local_a590 = local_a58c + (uint)((local_a574 ^ 0xff) & 1) * 2 + local_a578;
    local_a594 = local_a588 + (uint)((local_a572 ^ 0xff) & 1) * 8 + local_a57c;
    local_a598 = (local_6c << 4) <<
                 ((byte)*(undefined4 *)((long)local_a0 + (long)local_a584 * 4) & 0x1f);
    local_a59c = (local_70 << 4) << ((byte)*(undefined4 *)(local_98 + (long)local_a584 * 4) & 0x1f);
    memcpy(local_afd0,local_60 + (long)local_a584 * 0x146 + 2,0xa30);
    (*(code *)local_60[0x3d4])
              (local_a528 + (long)(local_a578 * -0x90 - local_a57c) * 2,0x90,local_afc0,
               local_a598 - local_a578,local_a59c - local_a57c,local_afa8,local_a590,local_a594);
    fill_borders_for_fbs_on_frame_boundary
              ((uint16_t *)CONCAT44(in_stack_ffffffffffff4fcc,in_stack_ffffffffffff4fc8),
               in_stack_ffffffffffff4fc4,in_stack_ffffffffffff4fc0,(_Bool)in_stack_ffffffffffff4fbf,
               (_Bool)in_stack_ffffffffffff4fbe,(_Bool)in_stack_ffffffffffff4fbd,
               (_Bool)in_stack_ffffffffffff4fbc);
    for (local_afd4 = 0; local_afd4 < (int)local_60[0x3d6]; local_afd4 = local_afd4 + 1) {
      get_cdef_filter_strengths
                (*(CDEF_PICK_METHOD *)((long)local_60 + 0x1ebc),&local_afd8,&local_afdc,local_afd4);
      in_stack_ffffffffffff4fc0 = local_a59c;
      in_stack_ffffffffffff4fc8 = local_afd8;
      uVar1 = get_filt_error((CdefSearchCtx *)inbuf._13752_8_,(macroblockd_plane *)inbuf._13744_8_,
                             (cdef_list *)inbuf._13736_8_,(int (*) [16])inbuf._13728_8_,
                             (int *)inbuf._13720_8_,(int (*) [16])inbuf._13712_8_,
                             (uint16_t *)local_a560[local_a584],
                             (uint8_t *)CONCAT44(in_stack_ffffffffffff4fb4,local_a56c[local_a584]),
                             local_a598,local_a59c,local_afd8,local_afdc,local_a570,local_a584,
                             local_8c,(uint)local_a539,(BLOCK_SIZE)local_a560[local_a584]);
      if (local_a584 < 2) {
        *(uint64_t *)
         (local_60[(long)local_a584 + 0x3e1] + (long)local_74 * 0x200 + (long)local_afd4 * 8) =
             uVar1;
      }
      else {
        lVar2 = local_60[0x3e2] + (long)local_74 * 0x200;
        *(uint64_t *)(lVar2 + (long)local_afd4 * 8) =
             uVar1 + *(long *)(lVar2 + (long)local_afd4 * 8);
      }
    }
  }
  *(int *)(local_60[0x3e3] + (long)local_74 * 4) =
       local_6c * 0x10 * *(int *)(local_80 + 0x3c) + local_70 * 0x10;
  return;
}

Assistant:

void av1_cdef_mse_calc_block(CdefSearchCtx *cdef_search_ctx,
                             struct aom_internal_error_info *error_info,
                             int fbr, int fbc, int sb_count) {
  // TODO(aomedia:3276): Pass error_info to the low-level functions as required
  // in future to handle error propagation.
  (void)error_info;
  const CommonModeInfoParams *const mi_params = cdef_search_ctx->mi_params;
  const YV12_BUFFER_CONFIG *ref = cdef_search_ctx->ref;
  const int coeff_shift = cdef_search_ctx->coeff_shift;
  const int *mi_wide_l2 = cdef_search_ctx->mi_wide_l2;
  const int *mi_high_l2 = cdef_search_ctx->mi_high_l2;

  // Declare and initialize the temporary buffers.
  DECLARE_ALIGNED(32, uint16_t, inbuf[CDEF_INBUF_SIZE]);
  cdef_list dlist[MI_SIZE_128X128 * MI_SIZE_128X128];
  int dir[CDEF_NBLOCKS][CDEF_NBLOCKS] = { { 0 } };
  int var[CDEF_NBLOCKS][CDEF_NBLOCKS] = { { 0 } };
  uint16_t *const in = inbuf + CDEF_VBORDER * CDEF_BSTRIDE + CDEF_HBORDER;
  int nhb = AOMMIN(MI_SIZE_64X64, mi_params->mi_cols - MI_SIZE_64X64 * fbc);
  int nvb = AOMMIN(MI_SIZE_64X64, mi_params->mi_rows - MI_SIZE_64X64 * fbr);
  int hb_step = 1, vb_step = 1;
  BLOCK_SIZE bs;

  const MB_MODE_INFO *const mbmi =
      mi_params->mi_grid_base[MI_SIZE_64X64 * fbr * mi_params->mi_stride +
                              MI_SIZE_64X64 * fbc];

  uint8_t *ref_buffer[MAX_MB_PLANE] = { ref->y_buffer, ref->u_buffer,
                                        ref->v_buffer };
  int ref_stride[MAX_MB_PLANE] = { ref->y_stride, ref->uv_stride,
                                   ref->uv_stride };

  if (mbmi->bsize == BLOCK_128X128 || mbmi->bsize == BLOCK_128X64 ||
      mbmi->bsize == BLOCK_64X128) {
    bs = mbmi->bsize;
    if (bs == BLOCK_128X128 || bs == BLOCK_128X64) {
      nhb = AOMMIN(MI_SIZE_128X128, mi_params->mi_cols - MI_SIZE_64X64 * fbc);
      hb_step = 2;
    }
    if (bs == BLOCK_128X128 || bs == BLOCK_64X128) {
      nvb = AOMMIN(MI_SIZE_128X128, mi_params->mi_rows - MI_SIZE_64X64 * fbr);
      vb_step = 2;
    }
  } else {
    bs = BLOCK_64X64;
  }
  // Get number of 8x8 blocks which are not skip. Cdef processing happens for
  // 8x8 blocks which are not skip.
  const int cdef_count = av1_cdef_compute_sb_list(
      mi_params, fbr * MI_SIZE_64X64, fbc * MI_SIZE_64X64, dlist, bs);
  const bool is_fb_on_frm_left_boundary = (fbc == 0);
  const bool is_fb_on_frm_right_boundary =
      (fbc + hb_step == cdef_search_ctx->nhfb);
  const bool is_fb_on_frm_top_boundary = (fbr == 0);
  const bool is_fb_on_frm_bottom_boundary =
      (fbr + vb_step == cdef_search_ctx->nvfb);
  const int yoff = CDEF_VBORDER * (!is_fb_on_frm_top_boundary);
  const int xoff = CDEF_HBORDER * (!is_fb_on_frm_left_boundary);
  int dirinit = 0;
  for (int pli = 0; pli < cdef_search_ctx->num_planes; pli++) {
    /* We avoid filtering the pixels for which some of the pixels to
    average are outside the frame. We could change the filter instead,
    but it would add special cases for any future vectorization. */
    const int hfilt_size = (nhb << mi_wide_l2[pli]);
    const int vfilt_size = (nvb << mi_high_l2[pli]);
    const int ysize =
        vfilt_size + CDEF_VBORDER * (!is_fb_on_frm_bottom_boundary) + yoff;
    const int xsize =
        hfilt_size + CDEF_HBORDER * (!is_fb_on_frm_right_boundary) + xoff;
    const int row = fbr * MI_SIZE_64X64 << mi_high_l2[pli];
    const int col = fbc * MI_SIZE_64X64 << mi_wide_l2[pli];
    struct macroblockd_plane pd = cdef_search_ctx->plane[pli];
    cdef_search_ctx->copy_fn(&in[(-yoff * CDEF_BSTRIDE - xoff)], CDEF_BSTRIDE,
                             pd.dst.buf, row - yoff, col - xoff, pd.dst.stride,
                             ysize, xsize);
    fill_borders_for_fbs_on_frame_boundary(
        inbuf, hfilt_size, vfilt_size, is_fb_on_frm_left_boundary,
        is_fb_on_frm_right_boundary, is_fb_on_frm_top_boundary,
        is_fb_on_frm_bottom_boundary);
    for (int gi = 0; gi < cdef_search_ctx->total_strengths; gi++) {
      int pri_strength, sec_strength;
      get_cdef_filter_strengths(cdef_search_ctx->pick_method, &pri_strength,
                                &sec_strength, gi);
      const uint64_t curr_mse = get_filt_error(
          cdef_search_ctx, &pd, dlist, dir, &dirinit, var, in, ref_buffer[pli],
          ref_stride[pli], row, col, pri_strength, sec_strength, cdef_count,
          pli, coeff_shift, bs);
      if (pli < 2)
        cdef_search_ctx->mse[pli][sb_count][gi] = curr_mse;
      else
        cdef_search_ctx->mse[1][sb_count][gi] += curr_mse;
    }
  }
  cdef_search_ctx->sb_index[sb_count] =
      MI_SIZE_64X64 * fbr * mi_params->mi_stride + MI_SIZE_64X64 * fbc;
}